

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemdelegate.cpp
# Opt level: O3

void __thiscall
QItemDelegate::drawDisplay
          (QItemDelegate *this,QPainter *painter,QStyleOptionViewItem *option,QRect *rect,
          QString *text)

{
  QTextLayout *pQVar1;
  ColorRole CVar2;
  QItemDelegatePrivate *this_00;
  QWidget *this_01;
  int iVar3;
  uint uVar4;
  Alignment AVar5;
  QStyle *pQVar6;
  ulong uVar7;
  ulong uVar8;
  ColorRole CVar9;
  ColorRole CVar10;
  ColorGroup CVar11;
  int lineWidth;
  long in_FS_OFFSET;
  undefined4 uVar12;
  undefined4 uVar13;
  QSizeF QVar14;
  QStyleOptionViewItem opt;
  double local_1c8;
  QArrayData *local_1a8;
  char16_t *pcStack_1a0;
  double local_198;
  double local_190;
  QArrayData *local_188;
  double local_180;
  QSize local_178;
  QRect local_170;
  QRectF local_158;
  QArrayData *local_138;
  char16_t *pcStack_130;
  qsizetype local_128;
  QRect local_118;
  QStyleOptionViewItem local_108;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  CVar2 = (option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
          super_QFlagsStorage<QStyle::StateFlag>.i;
  CVar10 = Light;
  if ((CVar2 >> 0x10 & 1) != 0) {
    CVar10 = CVar2 & Button ^ Button;
  }
  CVar9 = Button;
  if ((CVar2 & Button) != WindowText) {
    CVar9 = CVar10;
  }
  this_00 = *(QItemDelegatePrivate **)&(this->super_QAbstractItemDelegate).field_0x8;
  iVar3 = (int)option;
  CVar11 = iVar3 + 0x28;
  if ((short)CVar2 < 0) {
    QPalette::brush(CVar11,CVar9);
    QPainter::fillRect((QRect *)painter,(QBrush *)rect);
  }
  QPalette::brush(CVar11,CVar9);
  QPainter::setPen((QColor *)painter);
  if ((text->d).size == 0) goto LAB_0055a335;
  if (((option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
       super_QFlagsStorage<QStyle::StateFlag>.i & 0x400000) != 0) {
    QPainter::save();
    QPalette::brush(CVar11,CVar9);
    QPainter::setPen((QColor *)painter);
    local_108.super_QStyleOption.version = (rect->x1).m_i;
    local_108.super_QStyleOption.type = (rect->y1).m_i;
    local_108.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
    super_QFlagsStorage<QStyle::StateFlag>.i =
         (QFlagsStorageHelper<QStyle::StateFlag,_4>)((rect->x2).m_i + -1);
    local_108.super_QStyleOption.direction = (rect->y2).m_i - RightToLeft;
    QPainter::drawRects((QRect *)painter,(int)&local_108);
    QPainter::restore();
  }
  memset(&local_108,0xaa,0xd0);
  QStyleOptionViewItem::QStyleOptionViewItem(&local_108,option);
  this_01 = option->widget;
  if (this_01 == (QWidget *)0x0) {
    pQVar6 = QApplication::style();
  }
  else {
    pQVar6 = QWidget::style(this_01);
  }
  uVar4 = (**(code **)(*(long *)pQVar6 + 0xe0))(pQVar6,0x41,0,this_01);
  local_118.x1.m_i = (rect->x1).m_i + uVar4 + 1;
  local_118.x2.m_i = ~uVar4 + (rect->x2).m_i;
  local_118.y1.m_i = (rect->y1).m_i;
  local_118.y2.m_i = (rect->y2).m_i;
  uVar4 = (uint)(((byte)local_108.features.
                        super_QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>.
                        super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>.i & 1) == 0) *
          0x200 + (*(uint *)&this_00->textOption & 0xffffe1ff) + 0x200;
  *(uint *)&this_00->textOption = uVar4;
  *(LayoutDirection *)&this_00->textOption =
       uVar4 & 0xffff27ff |
       ((option->super_QStyleOption).direction & (LayoutDirectionAuto|RightToLeft)) << 0xe;
  AVar5 = QStyle::visualAlignment
                    ((option->super_QStyleOption).direction,
                     (Alignment)
                     (option->displayAlignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                     super_QFlagsStorage<Qt::AlignmentFlag>.i);
  *(uint *)&this_00->textOption =
       *(uint *)&this_00->textOption & 0xfffffe00 |
       (uint)AVar5.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
             super_QFlagsStorage<Qt::AlignmentFlag>.i & 0x1ff;
  pQVar1 = &this_00->textLayout;
  QTextLayout::setTextOption((QTextOption *)pQVar1);
  QTextLayout::setFont((QFont *)pQVar1);
  local_138 = &((text->d).d)->super_QArrayData;
  pcStack_130 = (text->d).ptr;
  local_128 = (text->d).size;
  if (local_138 != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&local_138->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)&local_138->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QString::replace((QChar)(char16_t)&local_138,(QChar)0xa,0x2028);
  local_198 = (double)local_128;
  pcStack_1a0 = pcStack_130;
  local_1a8 = local_138;
  local_138 = (QArrayData *)0x0;
  pcStack_130 = (char16_t *)0x0;
  local_128 = 0;
  QTextLayout::setText((QString *)pQVar1);
  if (local_1a8 != (QArrayData *)0x0) {
    LOCK();
    (local_1a8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_1a8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_1a8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_1a8,2,0x10);
    }
  }
  if (local_138 != (QArrayData *)0x0) {
    LOCK();
    (local_138->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_138->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_138->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_138,2,0x10);
    }
  }
  lineWidth = (local_118.x2.m_i - local_118.x1.m_i) + 1;
  QVar14 = QItemDelegatePrivate::doTextLayout(this_00,lineWidth);
  uVar12 = QVar14.ht._0_4_;
  uVar13 = QVar14.ht._4_4_;
  local_1c8 = QVar14.wd;
  if ((double)lineWidth < local_1c8) {
LAB_00559de1:
    local_1a8 = (QArrayData *)0x0;
    pcStack_1a0 = (char16_t *)0x0;
    local_198 = 0.0;
    local_158.yp = (qreal)(text->d).ptr;
    local_158.xp = (qreal)(text->d).size;
    uVar7 = QStringView::indexOf((QStringView *)&local_158,(QChar)0x2028,0,CaseSensitive);
    if ((int)uVar7 == -1) {
      QFontMetrics::elidedText((QString *)&local_158,iVar3 + 0x20,(int)text,option->textElideMode);
      QString::append((QString *)&local_1a8);
      if ((QArrayData *)local_158.xp != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_158.xp)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_158.xp)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_158.xp)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_158.xp,2,0x10);
        }
      }
    }
    else {
      do {
        QString::mid((longlong)&local_170,(longlong)text);
        QFontMetrics::elidedText
                  ((QString *)&local_158,iVar3 + 0x20,(int)&local_170,option->textElideMode);
        QString::append((QString *)&local_1a8);
        if ((QArrayData *)local_158.xp != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_158.xp)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_158.xp)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_158.xp)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_158.xp,2,0x10);
          }
        }
        if ((QArrayData *)local_170._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_170._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_170._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_170._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_170._0_8_,2,0x10);
          }
        }
        QString::append((QChar)(char16_t)&local_1a8);
        local_158.yp = (qreal)(text->d).ptr;
        local_158.xp = (qreal)(text->d).size;
        uVar8 = QStringView::indexOf
                          ((QStringView *)&local_158,(QChar)0x2028,(long)((int)uVar7 + 1),
                           CaseSensitive);
        uVar7 = uVar8 & 0xffffffff;
      } while ((int)uVar8 != -1);
      QString::mid((longlong)&local_170,(longlong)text);
      QFontMetrics::elidedText
                ((QString *)&local_158,iVar3 + 0x20,(int)&local_170,option->textElideMode);
      QString::append((QString *)&local_1a8);
      if ((QArrayData *)local_158.xp != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_158.xp)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_158.xp)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_158.xp)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_158.xp,2,0x10);
        }
      }
      if ((QArrayData *)local_170._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_170._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_170._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_170._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_170._0_8_,2,0x10);
        }
      }
    }
    QTextLayout::setText((QString *)pQVar1);
    QVar14 = QItemDelegatePrivate::doTextLayout(this_00,(local_118.x2.m_i - local_118.x1.m_i) + 1);
    uVar13 = QVar14.ht._4_4_;
    local_1c8 = QVar14.wd;
    if (local_1a8 != (QArrayData *)0x0) {
      LOCK();
      (local_1a8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_1a8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_1a8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_1a8,2,0x10);
      }
    }
    uVar12 = QVar14.ht._0_4_;
    lineWidth = (local_118.x2.m_i - local_118.x1.m_i) + 1;
  }
  else if ((double)((local_118.y2.m_i - local_118.y1.m_i) + 1) < QVar14.ht) goto LAB_00559de1;
  local_178.ht.m_i = (int)(double)CONCAT44(uVar13,uVar12);
  local_178.wd.m_i = lineWidth;
  local_170 = QStyle::alignedRect((option->super_QStyleOption).direction,
                                  (Alignment)
                                  (option->displayAlignment).
                                  super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                                  super_QFlagsStorage<Qt::AlignmentFlag>.i,&local_178,&local_118);
  if (*(char *)(*(long *)&(this->super_QAbstractItemDelegate).field_0x8 + 0x80) == '\0') {
    if (local_1c8 <= (double)((local_118.x2.m_i - local_118.x1.m_i) + 1)) {
      if ((double)CONCAT44(uVar13,uVar12) <= (double)((local_118.y2.m_i - local_118.y1.m_i) + 1))
      goto LAB_0055a11c;
    }
    QPainter::save();
    QPainter::setClipRect((QRect *)painter,(ClipOperation)&local_170);
    local_1a8 = (QArrayData *)(double)local_170.x1.m_i.m_i;
    pcStack_1a0 = (char16_t *)(double)local_170.y1.m_i.m_i;
    local_158.xp = 0.0;
    local_158.yp = 0.0;
    local_158.w = 0.0;
    local_198 = (double)(((long)local_170.x2.m_i - (long)local_170.x1.m_i.m_i) + 1);
    local_190 = (double)(((long)local_170.y2.m_i - ((long)local_170._0_8_ >> 0x20)) + 1);
    local_188 = local_1a8;
    local_180 = (double)pcStack_1a0;
    QTextLayout::draw((QPainter *)pQVar1,(QPointF *)painter,(QList_conflict *)&local_188,&local_158)
    ;
    QArrayDataPointer<QTextLayout::FormatRange>::~QArrayDataPointer
              ((QArrayDataPointer<QTextLayout::FormatRange> *)&local_158);
    QPainter::restore();
  }
  else {
LAB_0055a11c:
    local_1a8 = (QArrayData *)(double)local_170.x1.m_i.m_i;
    pcStack_1a0 = (char16_t *)(double)local_170.y1.m_i.m_i;
    local_158.xp = 0.0;
    local_158.yp = 0.0;
    local_158.w = 0.0;
    local_198 = (double)(((long)local_170.x2.m_i.m_i - (long)local_170.x1.m_i.m_i) + 1);
    local_190 = (double)(((local_170._8_8_ >> 0x20) - (local_170._0_8_ >> 0x20)) + 1);
    local_188 = local_1a8;
    local_180 = (double)pcStack_1a0;
    QTextLayout::draw((QPainter *)pQVar1,(QPointF *)painter,(QList_conflict *)&local_188,&local_158)
    ;
    QArrayDataPointer<QTextLayout::FormatRange>::~QArrayDataPointer
              ((QArrayDataPointer<QTextLayout::FormatRange> *)&local_158);
  }
  QBrush::~QBrush(&local_108.backgroundBrush);
  if (&(local_108.text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_108.text.d.d)->super_QArrayData,2,0x10);
    }
  }
  QIcon::~QIcon(&local_108.icon);
  QLocale::~QLocale(&local_108.locale);
  QFont::~QFont(&local_108.font);
  QStyleOption::~QStyleOption(&local_108.super_QStyleOption);
LAB_0055a335:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QItemDelegate::drawDisplay(QPainter *painter, const QStyleOptionViewItem &option,
                                const QRect &rect, const QString &text) const
{
    Q_D(const QItemDelegate);

    QPalette::ColorGroup cg = option.state & QStyle::State_Enabled
                              ? QPalette::Normal : QPalette::Disabled;
    if (cg == QPalette::Normal && !(option.state & QStyle::State_Active))
        cg = QPalette::Inactive;
    if (option.state & QStyle::State_Selected) {
        painter->fillRect(rect, option.palette.brush(cg, QPalette::Highlight));
        painter->setPen(option.palette.color(cg, QPalette::HighlightedText));
    } else {
        painter->setPen(option.palette.color(cg, QPalette::Text));
    }

    if (text.isEmpty())
        return;

    if (option.state & QStyle::State_Editing) {
        painter->save();
        painter->setPen(option.palette.color(cg, QPalette::Text));
        painter->drawRect(rect.adjusted(0, 0, -1, -1));
        painter->restore();
    }

    const QStyleOptionViewItem opt = option;

    const QWidget *widget = d->widget(option);
    QStyle *style = widget ? widget->style() : QApplication::style();
    const int textMargin = style->pixelMetric(QStyle::PM_FocusFrameHMargin, nullptr, widget) + 1;
    QRect textRect = rect.adjusted(textMargin, 0, -textMargin, 0); // remove width padding
    const bool wrapText = opt.features & QStyleOptionViewItem::WrapText;
    d->textOption.setWrapMode(wrapText ? QTextOption::WordWrap : QTextOption::ManualWrap);
    d->textOption.setTextDirection(option.direction);
    d->textOption.setAlignment(QStyle::visualAlignment(option.direction, option.displayAlignment));
    d->textLayout.setTextOption(d->textOption);
    d->textLayout.setFont(option.font);
    d->textLayout.setText(QItemDelegatePrivate::replaceNewLine(text));

    QSizeF textLayoutSize = d->doTextLayout(textRect.width());

    if (textRect.width() < textLayoutSize.width()
        || textRect.height() < textLayoutSize.height()) {
        QString elided;
        int start = 0;
        int end = text.indexOf(QChar::LineSeparator, start);
        if (end == -1) {
            elided += option.fontMetrics.elidedText(text, option.textElideMode, textRect.width());
        } else {
            while (end != -1) {
                elided += option.fontMetrics.elidedText(text.mid(start, end - start),
                                                        option.textElideMode, textRect.width());
                elided += QChar::LineSeparator;
                start = end + 1;
                end = text.indexOf(QChar::LineSeparator, start);
            }
            //let's add the last line (after the last QChar::LineSeparator)
            elided += option.fontMetrics.elidedText(text.mid(start),
                                                    option.textElideMode, textRect.width());
        }
        d->textLayout.setText(elided);
        textLayoutSize = d->doTextLayout(textRect.width());
    }

    const QSize layoutSize(textRect.width(), int(textLayoutSize.height()));
    const QRect layoutRect = QStyle::alignedRect(option.direction, option.displayAlignment,
                                                  layoutSize, textRect);
    // if we still overflow even after eliding the text, enable clipping
    if (!hasClipping() && (textRect.width() < textLayoutSize.width()
                           || textRect.height() < textLayoutSize.height())) {
        painter->save();
        painter->setClipRect(layoutRect);
        d->textLayout.draw(painter, layoutRect.topLeft(), QList<QTextLayout::FormatRange>(),
                           layoutRect);
        painter->restore();
    } else {
        d->textLayout.draw(painter, layoutRect.topLeft(), QList<QTextLayout::FormatRange>(),
                           layoutRect);
    }
}